

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O3

void __thiscall
TPZTensor<TFad<6,_double>_>::TPZTensor(TPZTensor<TFad<6,_double>_> *this,TPZDecomposed *eigensystem)

{
  uint uVar1;
  TFad<6,_double> local_60;
  
  (this->super_TPZSavable)._vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_018777a0;
  local_60.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_01835938;
  local_60.val_ = 0.0;
  local_60.dx_[0] = 0.0;
  local_60.dx_[1] = 0.0;
  local_60.dx_[2] = 0.0;
  local_60.dx_[3] = 0.0;
  local_60.dx_[4] = 0.0;
  local_60.dx_[5] = 0.0;
  TPZManVector<TFad<6,_double>,_6>::TPZManVector(&this->fData,6,&local_60);
  uVar1 = 0;
  do {
    TPZTensor<TFad<6,double>>::Add<TFad<6,double>,TFad<6,double>>
              ((TPZTensor<TFad<6,double>> *)this,
               (eigensystem->fEigentensors).super_TPZVec<TPZTensor<TFad<6,_double>_>_>.fStore +
               uVar1,(eigensystem->fEigenvalues).super_TPZVec<TFad<6,_double>_>.fStore + uVar1);
    uVar1 = (eigensystem->fGeometricMultiplicity).super_TPZVec<unsigned_int>.fStore[uVar1] + uVar1;
  } while (uVar1 < 3);
  return;
}

Assistant:

TPZTensor(const TPZDecomposed &eigensystem) : fData(6, T(0.)) {
        unsigned int i;
        for (i = 0; i < 3; i += eigensystem.fGeometricMultiplicity[i]) {
            Add(eigensystem.fEigentensors[i], eigensystem.fEigenvalues[i]);
        }
#ifdef PZDEBUG
        if (i != 3) {
            DebugStop();
        }
#endif
    }